

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

PropertySymOpnd * __thiscall Inline::GetMethodLdOpndForCallInstr(Inline *this,Instr *callInstr)

{
  Opnd *this_00;
  _func_int **pp_Var1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  undefined4 *puVar5;
  SymOpnd *pSVar6;
  PropertySymOpnd *pPVar7;
  _func_int *p_Var8;
  
  this_00 = callInstr->m_src1;
  OVar3 = IR::Opnd::GetKind(this_00);
  if (OVar3 == OpndKindReg) {
    OVar3 = IR::Opnd::GetKind(this_00);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_0053fe95;
      *puVar5 = 0;
    }
    if (*(char *)((long)this_00[1]._vptr_Opnd + 0x14) != '\x01') {
      return (PropertySymOpnd *)0x0;
    }
    OVar3 = IR::Opnd::GetKind(this_00);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_0053fe95;
      *puVar5 = 0;
    }
    pp_Var1 = this_00[1]._vptr_Opnd;
    if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar4) goto LAB_0053fe95;
      *puVar5 = 0;
    }
    if (((ulong)pp_Var1[3] & 1) == 0) {
      return (PropertySymOpnd *)0x0;
    }
    if (pp_Var1[5] == (_func_int *)0x0) {
      return (PropertySymOpnd *)0x0;
    }
    OVar3 = IR::Opnd::GetKind(this_00);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_0053fe95;
      *puVar5 = 0;
    }
    pp_Var1 = this_00[1]._vptr_Opnd;
    if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar4) goto LAB_0053fe95;
      *puVar5 = 0;
    }
    if (((ulong)pp_Var1[3] & 1) == 0) {
      p_Var8 = (_func_int *)0x0;
    }
    else {
      p_Var8 = pp_Var1[5];
    }
    if ((*(Opnd **)(p_Var8 + 0x48) != (Opnd *)0x0) &&
       (OVar3 = IR::Opnd::GetKind(*(Opnd **)(p_Var8 + 0x48)), OVar3 == OpndKindSym)) {
      pSVar6 = *(SymOpnd **)(p_Var8 + 0x48);
      OVar3 = IR::Opnd::GetKind(&pSVar6->super_Opnd);
      if (OVar3 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar4) {
LAB_0053fe95:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      bVar4 = IR::SymOpnd::IsPropertySymOpnd(pSVar6);
      if (bVar4) {
        pSVar6 = IR::Opnd::AsSymOpnd(*(Opnd **)(p_Var8 + 0x48));
        pPVar7 = IR::Opnd::AsPropertySymOpnd(&pSVar6->super_Opnd);
        return pPVar7;
      }
    }
  }
  return (PropertySymOpnd *)0x0;
}

Assistant:

IR::PropertySymOpnd*
Inline::GetMethodLdOpndForCallInstr(IR::Instr* callInstr)
{
    IR::Opnd* methodOpnd = callInstr->GetSrc1();
    if (methodOpnd->IsRegOpnd())
    {
        if (methodOpnd->AsRegOpnd()->m_sym->IsStackSym())
        {
            if (methodOpnd->AsRegOpnd()->m_sym->AsStackSym()->IsSingleDef())
            {
                IR::Instr* defInstr = methodOpnd->AsRegOpnd()->m_sym->AsStackSym()->GetInstrDef();
                if (defInstr->GetSrc1() && defInstr->GetSrc1()->IsSymOpnd() && defInstr->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd())
                {
                    return defInstr->GetSrc1()->AsSymOpnd()->AsPropertySymOpnd();
                }
                return nullptr;
            }
            return nullptr;
        }
        return nullptr;
    }
    return nullptr;
}